

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

_Bool ExportImageAsCode(Image image,char *fileName)

{
  char cVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *text;
  char *__src;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  char varFileName [256];
  
  uVar3 = GetPixelDataSize(image.width,image.height,image.format);
  text = (char *)calloc((long)(int)(uVar3 * 6 + 2000),1);
  memcpy(text,
         "////////////////////////////////////////////////////////////////////////////////////////\n"
         ,0x59);
  memcpy(text + 0x59,
         "//                                                                                    //\n"
         ,0x59);
  memcpy(text + 0xb2,
         "// ImageAsCode exporter v1.0 - Image pixel data exported as an array of bytes         //\n"
         ,0x59);
  memcpy(text + 0x10b,
         "//                                                                                    //\n"
         ,0x59);
  memcpy(text + 0x164,
         "// more info and bugs-report:  github.com/raysan5/raylib                              //\n"
         ,0x59);
  memcpy(text + 0x1bd,
         "// feedback and support:       ray[at]raylib.com                                      //\n"
         ,0x59);
  memcpy(text + 0x216,
         "//                                                                                    //\n"
         ,0x59);
  memcpy(text + 0x26f,
         "// Copyright (c) 2018-2024 Ramon Santamaria (@raysan5)                                //\n"
         ,0x59);
  memcpy(text + 0x2c8,
         "//                                                                                    //\n"
         ,0x59);
  memcpy(text + 0x321,
         "////////////////////////////////////////////////////////////////////////////////////////\n\n"
         ,0x5a);
  pcVar8 = varFileName;
  memset(pcVar8,0,0x100);
  __src = GetFileNameWithoutExt(fileName);
  strcpy(pcVar8,__src);
  for (; cVar1 = *pcVar8, cVar1 != '\0'; pcVar8 = pcVar8 + 1) {
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      *pcVar8 = cVar1 + -0x20;
    }
  }
  builtin_strncpy(text + 0x37b,"// Image data information\n",0x1b);
  iVar4 = sprintf(text + 0x395,"#define %s_WIDTH    %i\n",varFileName,(ulong)(uint)image.width);
  iVar5 = sprintf(text + (long)iVar4 + 0x395,"#define %s_HEIGHT   %i\n",varFileName,
                  (ulong)(uint)image.height);
  iVar6 = sprintf(text + (iVar5 + iVar4 + 0x395),
                  "#define %s_FORMAT   %i          // raylib internal pixel format\n\n",varFileName,
                  image.format);
  iVar4 = iVar6 + iVar4 + iVar5 + 0x395;
  iVar5 = sprintf(text + iVar4,"static unsigned char %s_DATA[%i] = { ",varFileName,(ulong)uVar3);
  iVar4 = iVar4 + iVar5;
  uVar7 = (long)(int)uVar3 - 1;
  uVar10 = 0;
  if (0 < (int)uVar7) {
    uVar10 = uVar7 & 0xffffffff;
  }
  uVar9 = 0;
  while( true ) {
    if (uVar10 == uVar9) break;
    pcVar8 = "0x%x,\n";
    if ((int)((uVar9 & 0xffffffff) / 0x14) * -0x14 + (int)uVar9 != 0) {
      pcVar8 = "0x%x, ";
    }
    iVar5 = sprintf(text + iVar4,pcVar8,(ulong)*(byte *)((long)image.data + uVar9));
    iVar4 = iVar4 + iVar5;
    uVar9 = uVar9 + 1;
  }
  sprintf(text + iVar4,"0x%x };\n",(ulong)*(byte *)((long)image.data + uVar7));
  _Var2 = SaveFileText(fileName,text);
  free(text);
  if (_Var2) {
    pcVar8 = "FILEIO: [%s] Image as code exported successfully";
    iVar4 = 3;
  }
  else {
    pcVar8 = "FILEIO: [%s] Failed to export image as code";
    iVar4 = 4;
  }
  TraceLog(iVar4,pcVar8,fileName);
  return _Var2;
}

Assistant:

bool ExportImageAsCode(Image image, const char *fileName)
{
    bool success = false;

#if defined(SUPPORT_IMAGE_EXPORT)

#ifndef TEXT_BYTES_PER_LINE
    #define TEXT_BYTES_PER_LINE     20
#endif

    int dataSize = GetPixelDataSize(image.width, image.height, image.format);

    // NOTE: Text data buffer size is estimated considering image data size in bytes
    // and requiring 6 char bytes for every byte: "0x00, "
    char *txtData = (char *)RL_CALLOC(dataSize*6 + 2000, sizeof(char));

    int byteCount = 0;
    byteCount += sprintf(txtData + byteCount, "////////////////////////////////////////////////////////////////////////////////////////\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "// ImageAsCode exporter v1.0 - Image pixel data exported as an array of bytes         //\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "// more info and bugs-report:  github.com/raysan5/raylib                              //\n");
    byteCount += sprintf(txtData + byteCount, "// feedback and support:       ray[at]raylib.com                                      //\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "// Copyright (c) 2018-2024 Ramon Santamaria (@raysan5)                                //\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "////////////////////////////////////////////////////////////////////////////////////////\n\n");

    // Get file name from path and convert variable name to uppercase
    char varFileName[256] = { 0 };
    strcpy(varFileName, GetFileNameWithoutExt(fileName));
    for (int i = 0; varFileName[i] != '\0'; i++) if ((varFileName[i] >= 'a') && (varFileName[i] <= 'z')) { varFileName[i] = varFileName[i] - 32; }

    // Add image information
    byteCount += sprintf(txtData + byteCount, "// Image data information\n");
    byteCount += sprintf(txtData + byteCount, "#define %s_WIDTH    %i\n", varFileName, image.width);
    byteCount += sprintf(txtData + byteCount, "#define %s_HEIGHT   %i\n", varFileName, image.height);
    byteCount += sprintf(txtData + byteCount, "#define %s_FORMAT   %i          // raylib internal pixel format\n\n", varFileName, image.format);

    byteCount += sprintf(txtData + byteCount, "static unsigned char %s_DATA[%i] = { ", varFileName, dataSize);
    for (int i = 0; i < dataSize - 1; i++) byteCount += sprintf(txtData + byteCount, ((i%TEXT_BYTES_PER_LINE == 0)? "0x%x,\n" : "0x%x, "), ((unsigned char *)image.data)[i]);
    byteCount += sprintf(txtData + byteCount, "0x%x };\n", ((unsigned char *)image.data)[dataSize - 1]);

    // NOTE: Text data size exported is determined by '\0' (NULL) character
    success = SaveFileText(fileName, txtData);

    RL_FREE(txtData);

#endif      // SUPPORT_IMAGE_EXPORT

    if (success != 0) TRACELOG(LOG_INFO, "FILEIO: [%s] Image as code exported successfully", fileName);
    else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to export image as code", fileName);

    return success;
}